

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::PrintValue<pstore::gsl::span<unsigned_char,_1l>,void>
               (span<unsigned_char,__1L> *container,ostream *os)

{
  reference ptVar1;
  long lVar2;
  iterator __begin0;
  iterator __end0;
  char local_49;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_48;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_38;
  
  local_48.span_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_48,container,0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_38,container,(container->storage_).super_extent_type<_1L>.size_);
  if (((span<unsigned_char,__1L> *)CONCAT71(local_48.span_._1_7_,local_48.span_._0_1_) !=
       local_38.span_) || (local_48.index_ != local_38.index_)) {
    lVar2 = 0;
    do {
      ptVar1 = pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
               operator*(&local_48);
      if (lVar2 != 0) {
        local_49 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
        if (lVar2 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_00121b30;
        }
      }
      local_49 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_49,1);
      PrintTo(*ptVar1,os);
      lVar2 = lVar2 + 1;
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                (&local_48);
    } while (((span<unsigned_char,__1L> *)CONCAT71(local_48.span_._1_7_,local_48.span_._0_1_) !=
              local_38.span_) || (local_48.index_ != local_38.index_));
    if (lVar2 != 0) {
LAB_00121b30:
      local_48.span_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
    }
  }
  local_48.span_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_48,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }